

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O3

void __thiscall
wasm::SimplifyLocals<true,_true,_true>::optimizeBlockReturn
          (SimplifyLocals<true,_true,_true> *this,Block *block)

{
  map<wasm::Name,_std::vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>_>_>_>
  *this_00;
  pointer *pppBVar1;
  Expression **ppEVar2;
  Expression *ast;
  size_t sVar3;
  Break *this_01;
  iterator __position;
  SimplifyLocals<true,_true,_true> *pSVar4;
  bool bVar5;
  Nop *output;
  const_iterator cVar6;
  mapped_type *pmVar7;
  size_type sVar8;
  _Base_ptr p_Var9;
  mapped_type *pmVar10;
  Type type_;
  Expression *pEVar11;
  Drop *this_02;
  LocalSet *pLVar12;
  undefined1 auVar13 [8];
  char *__function;
  _Rb_tree_header *p_Var14;
  Nop *output_1;
  long lVar15;
  ulong uVar16;
  Name *__k;
  Block *pBVar17;
  pair<std::_Rb_tree_iterator<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>_>_>_>
  pVar18;
  optional<wasm::Type> type__00;
  undefined1 local_380 [8];
  EffectAnalyzer value;
  EffectAnalyzer condition;
  Nop nop;
  undefined1 local_88 [8];
  FindAll<wasm::LocalSet> findAll;
  Block *local_68;
  Block *block_local;
  vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
  local_58;
  SimplifyLocals<true,_true,_true> *local_40;
  _Rb_tree_color local_34 [2];
  Index sharedIndex;
  
  if ((block->name).super_IString.str._M_str == (char *)0x0) {
    return;
  }
  __k = &block->name;
  local_68 = block;
  cVar6 = std::
          _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
          ::find(&(this->unoptimizableBlocks)._M_t,__k);
  if ((_Rb_tree_header *)cVar6._M_node !=
      &(this->unoptimizableBlocks)._M_t._M_impl.super__Rb_tree_header) {
    return;
  }
  this_00 = &this->blockBreaks;
  pmVar7 = std::
           map<wasm::Name,_std::vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>_>_>_>
           ::operator[](this_00,__k);
  local_58.
  super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pmVar7->
       super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_58.
  super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pmVar7->
       super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_58.
  super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pmVar7->
       super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (pmVar7->
  super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pmVar7->
  super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pmVar7->
  super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pVar18 = std::
           _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>_>_>_>
           ::equal_range(&this_00->_M_t,__k);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>_>_>_>
  ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar18.first._M_node,(_Base_ptr)pVar18.second._M_node);
  if (local_58.
      super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_58.
      super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    if ((*(local_58.
           super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
           ._M_impl.super__Vector_impl_data._M_start)->brp)->_id != BreakId) {
LAB_00b08647:
      __function = "T *wasm::Expression::cast() [T = wasm::Break]";
      goto LAB_00b08673;
    }
    if (*(long *)(*(local_58.
                    super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                    ._M_impl.super__Vector_impl_data._M_start)->brp + 2) != 0) {
      __assert_fail("!(*breaks[0].brp)->template cast<Break>()->value",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                    ,0x205,
                    "void wasm::SimplifyLocals<>::optimizeBlockReturn(Block *) [allowTee = true, allowStructure = true, allowNesting = true]"
                   );
    }
    local_34[0] = ~_S_red;
    p_Var9 = (this->sinkables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var14 = &(this->sinkables)._M_t._M_impl.super__Rb_tree_header;
    local_40 = this;
    if ((_Rb_tree_header *)p_Var9 != p_Var14) {
      findAll.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)&this->sinkables;
      do {
        if (local_58.
            super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_58.
            super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
            ._M_impl.super__Vector_impl_data._M_start) {
LAB_00b081c4:
          local_34[0] = p_Var9[1]._M_color;
          if (local_58.
              super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_58.
              super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
              ._M_impl.super__Vector_impl_data._M_start) goto LAB_00b083f5;
          block_local = (Block *)&condition.breakTargets._M_t._M_impl.super__Rb_tree_header.
                                  _M_node_count;
          uVar16 = 0;
          goto LAB_00b0822e;
        }
        lVar15 = 8;
        uVar16 = 0;
        while (sVar8 = std::
                       map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
                       ::count((map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
                                *)((long)&(local_58.
                                           super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->brp + lVar15)
                               ,&p_Var9[1]._M_color), sVar8 != 0) {
          uVar16 = uVar16 + 1;
          lVar15 = lVar15 + 0x38;
          if ((ulong)(((long)local_58.
                             super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_58.
                             super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7)
              <= uVar16) goto LAB_00b081c4;
        }
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
      } while ((_Rb_tree_header *)p_Var9 != p_Var14);
    }
  }
  goto LAB_00b0862c;
LAB_00b0822e:
  do {
    pmVar10 = std::
              map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
              ::at(&local_58.
                    super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar16].sinkables,local_34);
    pEVar11 = *local_58.
               super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar16].brp;
    if (pEVar11->_id != BreakId) goto LAB_00b08647;
    ppEVar2 = pmVar10->item;
    pLVar12 = (LocalSet *)*ppEVar2;
    if ((pLVar12->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id !=
        LocalSetId) goto LAB_00b0865e;
    ast = (Expression *)pEVar11[2].type.id;
    if (ast != (Expression *)0x0) {
      FindAll<wasm::LocalSet>::FindAll((FindAll<wasm::LocalSet> *)local_88,ast);
      pSVar4 = local_40;
      bVar5 = true;
      for (auVar13 = local_88;
          auVar13 !=
          (undefined1  [8])
          findAll.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
          _M_impl.super__Vector_impl_data._M_start; auVar13 = (undefined1  [8])((long)auVar13 + 8))
      {
        if (*(LocalSet **)auVar13 == pLVar12) {
          condition.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ = 0x16;
          *ppEVar2 = (Expression *)
                     &condition.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
          EffectAnalyzer::EffectAnalyzer
                    ((EffectAnalyzer *)
                     &value.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     &((local_40->
                       super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                       ).super_Pass.runner)->options,
                     (local_40->
                     super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                     ).
                     super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                     .
                     super_PostWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                     .
                     super_Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                     .currModule,(Expression *)pEVar11[2].type.id);
          EffectAnalyzer::EffectAnalyzer
                    ((EffectAnalyzer *)local_380,
                     &((pSVar4->
                       super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                       ).super_Pass.runner)->options,
                     (pSVar4->
                     super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                     ).
                     super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                     .
                     super_PostWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                     .
                     super_Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                     .currModule,(Expression *)pLVar12);
          *ppEVar2 = (Expression *)pLVar12;
          bVar5 = EffectAnalyzer::invalidates
                            ((EffectAnalyzer *)
                             &value.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count
                             ,(EffectAnalyzer *)local_380);
          std::
          _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
          ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                       *)&value.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
          std::
          _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
          ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                       *)&value.danglingPop);
          std::
          _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
          ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                       *)&value.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_node_count)
          ;
          std::
          _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
          ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                       *)&value.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count);
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)&value.localsRead._M_t._M_impl.super__Rb_tree_header._M_node_count);
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)&value.features);
          std::
          _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
          ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                       *)block_local);
          std::
          _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
          ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                       *)&condition.danglingPop);
          std::
          _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
          ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                       *)&condition.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header.
                          _M_node_count);
          std::
          _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
          ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                       *)&condition.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count);
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)&condition.localsRead._M_t._M_impl.super__Rb_tree_header._M_node_count);
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)&condition.features);
          bVar5 = !bVar5;
          break;
        }
      }
      if (local_88 != (undefined1  [8])0x0) {
        operator_delete((void *)local_88,
                        (long)findAll.list.
                              super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)local_88);
      }
      if (!bVar5) goto LAB_00b0862c;
    }
    uVar16 = uVar16 + 1;
  } while (uVar16 < (ulong)(((long)local_58.
                                   super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_58.
                                   super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3) *
                           0x6db6db6db6db6db7));
LAB_00b083f5:
  pBVar17 = local_68;
  sVar3 = (local_68->list).
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
  if ((sVar3 == 0) ||
     ((local_68->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      data[sVar3 - 1]->_id != NopId)) {
    __position._M_current =
         (local_40->blocksToEnlarge).
         super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (local_40->blocksToEnlarge).
        super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<wasm::Block*,std::allocator<wasm::Block*>>::_M_realloc_insert<wasm::Block*const&>
                ((vector<wasm::Block*,std::allocator<wasm::Block*>> *)&local_40->blocksToEnlarge,
                 __position,&local_68);
    }
    else {
      *__position._M_current = local_68;
      pppBVar1 = &(local_40->blocksToEnlarge).
                  super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppBVar1 = *pppBVar1 + 1;
    }
  }
  else {
    pmVar10 = std::
              map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
              ::at((map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
                    *)findAll.list.
                      super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,local_34);
    ppEVar2 = pmVar10->item;
    pEVar11 = *ppEVar2;
    if (pEVar11->_id != LocalSetId) {
LAB_00b0865e:
      __function = "T *wasm::Expression::cast() [T = wasm::LocalSet]";
LAB_00b08673:
      __assert_fail("int(_id) == int(T::SpecificId)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                    ,0x31b,__function);
    }
    sVar3 = (pBVar17->list).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
    if (sVar3 == 0) {
      __assert_fail("index < usedElements",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                    ,0xbc,
                    "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                   );
    }
    (pBVar17->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
    [sVar3 - 1] = (Expression *)pEVar11[1].type.id;
    pEVar11 = *ppEVar2;
    pEVar11->_id = NopId;
    (pEVar11->type).id = 0;
    if (local_58.
        super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_58.
        super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      lVar15 = 8;
      uVar16 = 0;
      do {
        pmVar10 = std::
                  map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
                  ::at((map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
                        *)((long)&(local_58.
                                   super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->brp + lVar15),
                       local_34);
        pBVar17 = *(Block **)
                   ((long)local_58.
                          super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar15 + -8);
        this_01 = *(Break **)
                   &(pBVar17->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression;
        if ((this_01->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression._id !=
            BreakId) goto LAB_00b08647;
        if (this_01->value != (Expression *)0x0) {
          __assert_fail("!br->value",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                        ,0x25d,
                        "void wasm::SimplifyLocals<>::optimizeBlockReturn(Block *) [allowTee = true, allowStructure = true, allowNesting = true]"
                       );
        }
        ppEVar2 = pmVar10->item;
        pLVar12 = (LocalSet *)*ppEVar2;
        if ((pLVar12->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id !=
            LocalSetId) goto LAB_00b0865e;
        if (this_01->condition == (Expression *)0x0) {
          this_01->value = pLVar12->value;
          (pLVar12->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id = NopId;
          (pLVar12->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id = 0;
        }
        else {
          this_01->value = (Expression *)pLVar12;
          block_local = pBVar17;
          type_ = Function::getLocalType
                            ((local_40->
                             super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                             ).
                             super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                             .
                             super_PostWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                             .
                             super_Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                             .currFunction,pLVar12->index);
          LocalSet::makeTee(pLVar12,type_);
          pEVar11 = (Expression *)
                    MixedArena::allocSpace
                              (&((local_40->
                                 super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                                 ).
                                 super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                                 .
                                 super_PostWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                                 .
                                 super_Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                                .currModule)->allocator,0x10,8);
          pEVar11->_id = NopId;
          (pEVar11->type).id = 0;
          *ppEVar2 = pEVar11;
          Break::finalize(this_01);
          this_02 = (Drop *)MixedArena::allocSpace
                                      (&((local_40->
                                         super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                                         ).
                                         super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                                         .
                                         super_PostWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                                         .
                                         super_Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                                        .currModule)->allocator,0x18,8);
          (this_02->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id =
               DropId;
          (this_02->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0
          ;
          this_02->value = (Expression *)this_01;
          Drop::finalize(this_02);
          *(Drop **)&(block_local->super_SpecificExpression<(wasm::Expression::Id)1>).
                     super_Expression = this_02;
        }
        uVar16 = uVar16 + 1;
        lVar15 = lVar15 + 0x38;
        pBVar17 = local_68;
      } while (uVar16 < (ulong)(((long)local_58.
                                       super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_58.
                                       super__Vector_base<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               0x6db6db6db6db6db7));
    }
    pSVar4 = local_40;
    value.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)(local_40->
                 super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                 ).
                 super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                 .
                 super_PostWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                 .
                 super_Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                 .currModule;
    pLVar12 = Builder::makeLocalSet
                        ((Builder *)
                         &value.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         local_34[0],(Expression *)pBVar17);
    Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
    ::replaceCurrent((Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                      *)&(pSVar4->
                         super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                         ).
                         super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                     ,(Expression *)pLVar12);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>,_std::_Select1st<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
    ::clear((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>,_std::_Select1st<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
             *)findAll.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage);
    local_40->anotherCycle = true;
    type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pLVar12;
    Block::finalize(pBVar17,type__00,Unknown);
  }
LAB_00b0862c:
  std::
  vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>
  ::~vector(&local_58);
  return;
}

Assistant:

void optimizeBlockReturn(Block* block) {
    if (!block->name.is() || unoptimizableBlocks.count(block->name) > 0) {
      return;
    }
    auto breaks = std::move(blockBreaks[block->name]);
    blockBreaks.erase(block->name);
    if (breaks.size() == 0) {
      // block has no branches TODO we might optimize trivial stuff here too
      return;
    }
    // block does not already have a return value (if one break has one, they
    // all do)
    assert(!(*breaks[0].brp)->template cast<Break>()->value);
    // look for a local.set that is present in them all
    bool found = false;
    Index sharedIndex = -1;
    for (auto& [index, _] : sinkables) {
      bool inAll = true;
      for (size_t j = 0; j < breaks.size(); j++) {
        if (breaks[j].sinkables.count(index) == 0) {
          inAll = false;
          break;
        }
      }
      if (inAll) {
        sharedIndex = index;
        found = true;
        break;
      }
    }
    if (!found) {
      return;
    }
    // If one of our brs is a br_if, then we will give it a value. since
    // the value executes before the condition, it is dangerous if we are
    // moving code out of the condition,
    //  (br_if
    //   (block
    //    ..use $x..
    //    (local.set $x ..)
    //   )
    //  )
    // =>
    //  (br_if
    //   (local.tee $x ..) ;; this now affects the use!
    //   (block
    //    ..use $x..
    //   )
    //  )
    // so we must check for that.
    for (size_t j = 0; j < breaks.size(); j++) {
      // move break local.set's value to the break
      auto* breakLocalSetPointer = breaks[j].sinkables.at(sharedIndex).item;
      auto* brp = breaks[j].brp;
      auto* br = (*brp)->template cast<Break>();
      auto* set = (*breakLocalSetPointer)->template cast<LocalSet>();
      if (br->condition) {
        // TODO: optimize
        FindAll<LocalSet> findAll(br->condition);
        for (auto* otherSet : findAll.list) {
          if (otherSet == set) {
            // the set is indeed in the condition, so we can't just move it
            // but maybe there are no effects? see if, ignoring the set
            // itself, there is any risk
            Nop nop;
            *breakLocalSetPointer = &nop;
            EffectAnalyzer condition(
              this->getPassOptions(), *this->getModule(), br->condition);
            EffectAnalyzer value(
              this->getPassOptions(), *this->getModule(), set);
            *breakLocalSetPointer = set;
            if (condition.invalidates(value)) {
              // indeed, we can't do this, stop
              return;
            }
            break; // we found set in the list, can stop now
          }
        }
      }
    }
    // Great, this local is set in them all, we can optimize!
    if (block->list.size() == 0 || !block->list.back()->is<Nop>()) {
      // We can't do this here, since we can't push to the block -
      // it would invalidate sinkable pointers. So we queue a request
      // to grow the block at the end of the turn, we'll get this next
      // cycle.
      blocksToEnlarge.push_back(block);
      return;
    }
    // move block local.set's value to the end, in return position, and nop the
    // set
    auto* blockLocalSetPointer = sinkables.at(sharedIndex).item;
    auto* value = (*blockLocalSetPointer)->template cast<LocalSet>()->value;
    block->list[block->list.size() - 1] = value;
    ExpressionManipulator::nop(*blockLocalSetPointer);
    for (size_t j = 0; j < breaks.size(); j++) {
      // move break local.set's value to the break
      auto* breakLocalSetPointer = breaks[j].sinkables.at(sharedIndex).item;
      auto* brp = breaks[j].brp;
      auto* br = (*brp)->template cast<Break>();
      assert(!br->value);
      // if the break is conditional, then we must set the value here - if the
      // break is not reached, we must still have the new value in the local
      auto* set = (*breakLocalSetPointer)->template cast<LocalSet>();
      if (br->condition) {
        br->value = set;
        set->makeTee(this->getFunction()->getLocalType(set->index));
        *breakLocalSetPointer =
          this->getModule()->allocator.template alloc<Nop>();
        // in addition, as this is a conditional br that now has a value, it now
        // returns a value, so it must be dropped
        br->finalize();
        *brp = Builder(*this->getModule()).makeDrop(br);
      } else {
        br->value = set->value;
        ExpressionManipulator::nop(set);
      }
    }
    // finally, create a local.set on the block itself
    auto* newLocalSet =
      Builder(*this->getModule()).makeLocalSet(sharedIndex, block);
    this->replaceCurrent(newLocalSet);
    sinkables.clear();
    anotherCycle = true;
    block->finalize();
  }